

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

nk_bool nk_combo_begin_image_text(nk_context *ctx,char *selected,int len,nk_image img,nk_vec2 size)

{
  nk_vec2 nVar1;
  nk_symbol_type type;
  nk_window *win;
  nk_rect r;
  nk_rect header;
  undefined1 auVar2 [16];
  byte bVar3;
  nk_widget_layout_states nVar4;
  nk_bool nVar5;
  long lVar6;
  nk_context *i;
  nk_style_combo *pnVar7;
  nk_bool nVar8;
  float fVar9;
  float fVar10;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  nk_rect r_00;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect r_01;
  nk_rect b;
  nk_text text;
  nk_rect local_d8;
  nk_rect local_c8;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  nk_text local_98;
  nk_rect local_88;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined1 local_58 [16];
  nk_rect local_40;
  
  nVar8 = 0;
  nVar5 = 0;
  if (((ctx != (nk_context *)0x0) && (win = ctx->current, nVar5 = nVar8, win != (nk_window *)0x0))
     && (win->layout != (nk_panel *)0x0)) {
    local_58._8_4_ = in_XMM0_Dc;
    local_58._0_8_ = size;
    local_58._12_4_ = in_XMM0_Dd;
    nVar4 = nk_widget(&local_d8,ctx);
    if (nVar4 != NK_WIDGET_INVALID) {
      i = ctx;
      if ((win->layout->flags & 0x1000) != 0) {
        i = (nk_context *)0x0;
      }
      if (nVar4 == NK_WIDGET_ROM) {
        i = (nk_context *)0x0;
      }
      local_b8._4_4_ = local_d8.h;
      local_b8._0_4_ = local_d8.w;
      r.w = local_d8.w;
      r.x = local_d8.x;
      r.y = local_d8.y;
      r.h = local_d8.h;
      local_c8.x = local_d8.x;
      local_c8.y = local_d8.y;
      local_c8.w = 0.0;
      local_c8.h = 0.0;
      local_b8._8_8_ = 0;
      nVar5 = nk_button_behavior(&ctx->last_widget_state,r,&i->input,NK_BUTTON_DEFAULT);
      auVar2 = local_b8;
      local_a8[0] = nVar5 != 0;
      if ((ctx->last_widget_state & 0x20) == 0) {
        if ((ctx->last_widget_state & 0x10) == 0) {
          pnVar7 = &(ctx->style).combo;
          local_98.text = (ctx->style).combo.label_normal;
        }
        else {
          pnVar7 = (nk_style_combo *)&(ctx->style).combo.hover;
          local_98.text = (ctx->style).combo.label_hover;
        }
      }
      else {
        pnVar7 = (nk_style_combo *)&(ctx->style).combo.active;
        local_98.text = (ctx->style).combo.label_active;
      }
      local_b8 = auVar2;
      if ((pnVar7->normal).type == NK_STYLE_ITEM_IMAGE) {
        local_98.background.r = '\0';
        local_98.background.g = '\0';
        local_98.background.b = '\0';
        local_98.background.a = '\0';
        r_00.w = (float)local_b8._0_4_;
        r_00.h = (float)local_b8._4_4_;
        r_00.x = local_c8.x;
        r_00.y = local_c8.y;
        nk_draw_image(&win->buffer,r_00,&(pnVar7->normal).data.image,(nk_color)0xffffffff);
      }
      else {
        local_98.background = (pnVar7->normal).data.color;
        rect.w = (float)local_b8._0_4_;
        rect.h = (float)local_b8._4_4_;
        rect.x = local_c8.x;
        rect.y = local_c8.y;
        nk_fill_rect(&win->buffer,rect,(ctx->style).combo.rounding,local_98.background);
        auVar2 = local_b8;
        rect_00.w = (float)local_b8._0_4_;
        rect_00.h = (float)local_b8._4_4_;
        rect_00.x = local_c8.x;
        rect_00.y = local_c8.y;
        local_b8 = auVar2;
        nk_stroke_rect(&win->buffer,rect_00,(ctx->style).combo.rounding,(ctx->style).combo.border,
                       (ctx->style).combo.border_color);
      }
      lVar6 = 0x1be4;
      if ((ctx->last_widget_state & 0x10) == 0) {
        lVar6 = (ulong)(nVar5 != 0) * 8 + 0x1be0;
      }
      bVar3 = local_a8[0];
      type = *(nk_symbol_type *)((long)&(ctx->input).keyboard.keys[0].down + lVar6);
      fVar9 = (ctx->style).combo.button_padding.y;
      local_88.y = local_d8.y + fVar9;
      local_88.w = local_d8.h - (fVar9 + fVar9);
      local_a8._4_4_ = 0;
      local_a8._8_4_ = 0;
      local_a8._12_4_ = 0;
      local_c8.x = local_d8.x;
      local_c8.y = local_d8.y;
      local_c8.w = 0.0;
      local_c8.h = 0.0;
      local_a8._0_4_ = local_d8.w + local_d8.x;
      local_b8 = ZEXT416((uint)local_d8.h);
      local_88.x = ((float)local_a8._0_4_ - local_d8.h) - (ctx->style).combo.button_padding.x;
      nVar1 = (ctx->style).combo.button.padding;
      fVar9 = nVar1.x;
      fVar10 = nVar1.y;
      local_40.x = local_88.x + fVar9;
      local_40.y = local_88.y + fVar10;
      local_40.w = local_88.w - (fVar9 + fVar9);
      local_40.h = local_88.w - (fVar10 + fVar10);
      local_88.h = local_88.w;
      if (type != NK_SYMBOL_NONE) {
        local_a8 = ZEXT416((uint)local_88.x);
        nk_draw_button_symbol
                  (&win->buffer,&local_88,&local_40,ctx->last_widget_state,
                   &(ctx->style).combo.button,type,(ctx->style).font);
      }
      nVar1 = (ctx->style).combo.content_padding;
      local_78 = local_c8.x + nVar1.x;
      fVar9 = nVar1.y;
      fStack_74 = local_c8.y + fVar9;
      fStack_70 = local_c8.w + 0.0;
      fStack_6c = local_c8.h + 0.0;
      r_01.w = (float)local_b8._0_4_ - (fVar9 + fVar9);
      uStack_64 = local_b8._4_4_;
      uStack_60 = local_b8._8_4_;
      uStack_5c = local_b8._12_4_;
      r_01.y = fStack_74;
      r_01.x = local_78;
      r_01.h = r_01.w;
      local_68 = r_01.w;
      nk_draw_image(&win->buffer,r_01,&img,(nk_color)0xffffffff);
      local_98.padding.x = 0.0;
      local_98.padding.y = 0.0;
      nVar1 = (ctx->style).combo.content_padding;
      fVar9 = nVar1.x;
      fVar10 = nVar1.y;
      b.x = local_68 + local_78 + (ctx->style).combo.spacing.x + fVar9;
      b.y = local_c8.y + fVar10;
      b.w = ((float)local_a8._0_4_ - fVar9) - b.x;
      b.h = (float)local_b8._0_4_ - (fVar10 + fVar10);
      nk_widget_text(&win->buffer,b,selected,len,&local_98,0x11,(ctx->style).font);
      header.w = local_d8.w;
      header.x = local_d8.x;
      header.y = local_d8.y;
      header.h = local_d8.h;
      nVar5 = nk_combo_begin(ctx,win,(nk_vec2)local_58._0_8_,(uint)bVar3,header);
    }
  }
  return nVar5;
}

Assistant:

NK_API nk_bool
nk_combo_begin_image_text(struct nk_context *ctx, const char *selected, int len,
struct nk_image img, struct nk_vec2 size)
{
struct nk_window *win;
struct nk_style *style;
struct nk_input *in;

struct nk_rect header;
int is_clicked = nk_false;
enum nk_widget_layout_states s;
const struct nk_style_item *background;
struct nk_text text;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout)
return 0;

win = ctx->current;
style = &ctx->style;
s = nk_widget(&header, ctx);
if (!s) return 0;

in = (win->layout->flags & NK_WINDOW_ROM || s == NK_WIDGET_ROM)? 0: &ctx->input;
if (nk_button_behavior(&ctx->last_widget_state, header, in, NK_BUTTON_DEFAULT))
is_clicked = nk_true;

/* draw combo box header background and border */
if (ctx->last_widget_state & NK_WIDGET_STATE_ACTIVED) {
background = &style->combo.active;
text.text = style->combo.label_active;
} else if (ctx->last_widget_state & NK_WIDGET_STATE_HOVER) {
background = &style->combo.hover;
text.text = style->combo.label_hover;
} else {
background = &style->combo.normal;
text.text = style->combo.label_normal;
}
if (background->type == NK_STYLE_ITEM_IMAGE) {
text.background = nk_rgba(0,0,0,0);
nk_draw_image(&win->buffer, header, &background->data.image, nk_white);
} else {
text.background = background->data.color;
nk_fill_rect(&win->buffer, header, style->combo.rounding, background->data.color);
nk_stroke_rect(&win->buffer, header, style->combo.rounding, style->combo.border, style->combo.border_color);
}
{
struct nk_rect content;
struct nk_rect button;
struct nk_rect label;
struct nk_rect image;
int draw_button_symbol;

enum nk_symbol_type sym;
if (ctx->last_widget_state & NK_WIDGET_STATE_HOVER)
sym = style->combo.sym_hover;
else if (is_clicked)
sym = style->combo.sym_active;
else sym = style->combo.sym_normal;

/* represents whether or not the combo's button symbol should be drawn */
draw_button_symbol = sym != NK_SYMBOL_NONE;

/* calculate button */
button.w = header.h - 2 * style->combo.button_padding.y;
button.x = (header.x + header.w - header.h) - style->combo.button_padding.x;
button.y = header.y + style->combo.button_padding.y;
button.h = button.w;

content.x = button.x + style->combo.button.padding.x;
content.y = button.y + style->combo.button.padding.y;
content.w = button.w - 2 * style->combo.button.padding.x;
content.h = button.h - 2 * style->combo.button.padding.y;
if (draw_button_symbol)
nk_draw_button_symbol(&win->buffer, &button, &content, ctx->last_widget_state,
&ctx->style.combo.button, sym, style->font);

/* draw image */
image.x = header.x + style->combo.content_padding.x;
image.y = header.y + style->combo.content_padding.y;
image.h = header.h - 2 * style->combo.content_padding.y;
image.w = image.h;
nk_draw_image(&win->buffer, image, &img, nk_white);

/* draw label */
text.padding = nk_vec2(0,0);
label.x = image.x + image.w + style->combo.spacing.x + style->combo.content_padding.x;
label.y = header.y + style->combo.content_padding.y;
label.h = header.h - 2 * style->combo.content_padding.y;
if (draw_button_symbol)
label.w = (button.x - style->combo.content_padding.x) - label.x;
else
label.w = (header.x + header.w - style->combo.content_padding.x) - label.x;
nk_widget_text(&win->buffer, label, selected, len, &text, NK_TEXT_LEFT, style->font);
}
return nk_combo_begin(ctx, win, size, is_clicked, header);
}